

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O0

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numConflicts,int numSynergies)

{
  int iVar1;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> a;
  Interaction i_00;
  Interaction i_01;
  edge_descriptor e;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> b;
  edge_descriptor e_00;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> a_00;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> b_00;
  size_type sVar2;
  const_reference pvVar3;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
  __result;
  reference pvVar4;
  const_reference pvVar5;
  edge_bundled *peVar6;
  bool local_471;
  bool local_421;
  undefined1 auStack_348 [8];
  Interaction interaction_1;
  int interactionCost_1;
  undefined1 local_2d0 [4];
  int cost_1;
  Graph g_1;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> action_1;
  pair<int,_int> local_268;
  _Self local_260;
  pair<int,_int> local_258;
  _Self local_250;
  int local_244;
  int local_240;
  int actB_1;
  int actA_1;
  int i_2;
  Interaction IStack_230;
  undefined8 local_1e8;
  unsigned_long uStack_1e0;
  unsigned_long local_1d8;
  property_type *ppStack_1d0;
  undefined8 local_1c8;
  unsigned_long uStack_1c0;
  unsigned_long local_1b8;
  property_type *ppStack_1b0;
  undefined1 auStack_1a8 [8];
  Interaction interaction;
  int interactionCost;
  undefined1 local_130 [4];
  int cost;
  Graph g;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> action;
  pair<int,_int> local_c8;
  _Self local_c0;
  pair<int,_int> local_b8;
  _Self local_b0;
  int local_a4;
  int local_a0;
  int actB;
  int actA;
  int i_1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  anon_class_4_1_54a39809 local_40;
  int i;
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  local_29;
  int local_28;
  int local_24;
  int numSynergies_local;
  int numConflicts_local;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  *graphs_local;
  vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
  *actions_local;
  Scenario *this_local;
  
  local_28 = numSynergies;
  local_24 = numConflicts;
  _numSynergies_local = graphs;
  graphs_local = (vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                  *)actions;
  actions_local =
       (vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
        *)this;
  sVar2 = std::
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          ::size(actions);
  std::
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  ::allocator(&local_29);
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,sVar2,&local_29);
  std::
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  ::~allocator(&local_29);
  memset(&this->allActions,0,0x18);
  std::
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ::vector(&this->allActions);
  for (local_40.i = 0;
      sVar2 = std::
              vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
              ::size((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                      *)graphs_local), (ulong)(long)local_40.i < sVar2; local_40.i = local_40.i + 1)
  {
    pvVar3 = std::
             vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
             ::operator[]((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                           *)graphs_local,(long)local_40.i);
    __first = std::
              vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
              ::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
             ::operator[]((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                           *)graphs_local,(long)local_40.i);
    __last = std::
             vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
             ::end(pvVar3);
    __result = std::
               back_inserter<std::vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>
                         (&this->allActions);
    generated._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 transform<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>const*,std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>,std::back_insert_iterator<std::vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>,multi_agent_planning::Scenario::Scenario(std::vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>,std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>const&,std::vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>>>const&,int,int)::__0>
                           ((__normal_iterator<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                             )__last._M_current,__result,local_40);
  }
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&actA);
  for (actB = 0; actB < local_24; actB = actB + 1) {
    do {
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_a0 = getRndInt((int)sVar2 + -1);
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_a4 = getRndInt((int)sVar2 + -1);
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_a0);
      iVar1 = pvVar4->first;
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_a4);
      local_421 = true;
      if (iVar1 != pvVar4->first) {
        local_b8 = std::make_pair<int&,int&>(&local_a0,&local_a4);
        local_b0._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)&actA,&local_b8);
        local_c0._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)&actA);
        local_421 = std::operator!=(&local_b0,&local_c0);
      }
    } while (local_421 != false);
    local_c8 = std::make_pair<int&,int&>(&local_a0,&local_a4);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&actA,&local_c8);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_a4);
    g.m_property.px = *(no_property **)pvVar4;
    e.super_edge_base<boost::directed_tag,_unsigned_long> =
         (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>;
    e.m_eproperty = (pvVar4->second).m_eproperty;
    pvVar5 = std::
             vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
             ::operator[](_numSynergies_local,(long)(int)g.m_property.px);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                      *)local_130,pvVar5);
    peVar6 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
             ::operator[]((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                           *)local_130,e);
    iVar1 = peVar6->cost;
    do {
      interaction._68_4_ = getRndInt(iVar1);
    } while (interaction._68_4_ == 0);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_a0);
    local_1c8 = *(undefined8 *)pvVar4;
    uStack_1c0 = (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    local_1b8 = (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    ppStack_1b0 = (pvVar4->second).m_eproperty;
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_a4);
    local_1e8 = *(undefined8 *)pvVar4;
    uStack_1e0 = (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    local_1d8 = (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    ppStack_1d0 = (pvVar4->second).m_eproperty;
    b.first = pvVar4->first;
    b._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
    b.second = pvVar4->second;
    a.second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = uStack_1c0;
    a._0_8_ = local_1c8;
    a.second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target = local_1b8;
    a.second.m_eproperty = ppStack_1b0;
    Interaction::Interaction((Interaction *)auStack_1a8,a,b,interaction._68_4_);
    IStack_230.actionB.m_eproperty = interaction.actionB.m_eproperty;
    IStack_230.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    IStack_230.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    IStack_230.actionA.m_eproperty = interaction.actionA.m_eproperty;
    IStack_230.agentB = interaction.agentB;
    IStack_230._36_4_ = interaction._36_4_;
    IStack_230.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    IStack_230.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    _actA_1 = auStack_1a8;
    IStack_230.agentA = interaction.agentA;
    IStack_230._4_4_ = interaction._4_4_;
    i_00.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction._0_8_;
    i_00._0_8_ = auStack_1a8;
    i_00.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_00.actionA.m_eproperty =
         (property_type *)
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_00._32_8_ = interaction.actionA.m_eproperty;
    i_00.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction._32_8_;
    i_00.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_00.actionB.m_eproperty =
         (property_type *)
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_00._64_8_ = interaction.actionB.m_eproperty;
    insertInteraction(this,i_00);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                       *)local_130);
  }
  for (actB_1 = 0; actB_1 < local_28; actB_1 = actB_1 + 1) {
    do {
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_240 = getRndInt((int)sVar2 + -1);
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_244 = getRndInt((int)sVar2 + -1);
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_240);
      iVar1 = pvVar4->first;
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_244);
      local_471 = true;
      if (iVar1 != pvVar4->first) {
        local_258 = std::make_pair<int&,int&>(&local_240,&local_244);
        local_250._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)&actA,&local_258);
        local_260._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)&actA);
        local_471 = std::operator!=(&local_250,&local_260);
      }
    } while (local_471 != false);
    local_268 = std::make_pair<int&,int&>(&local_240,&local_244);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&actA,&local_268);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_244);
    g_1.m_property.px = *(no_property **)pvVar4;
    e_00.super_edge_base<boost::directed_tag,_unsigned_long> =
         (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>;
    e_00.m_eproperty = (pvVar4->second).m_eproperty;
    pvVar5 = std::
             vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
             ::operator[](_numSynergies_local,(long)(int)g_1.m_property.px);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                      *)local_2d0,pvVar5);
    peVar6 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
             ::operator[]((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                           *)local_2d0,e_00);
    iVar1 = peVar6->cost;
    do {
      interaction_1._68_4_ = getRndInt(-iVar1,0);
    } while (interaction_1._68_4_ == 0);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_240);
    a_00.first = pvVar4->first;
    a_00._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
    a_00.second = pvVar4->second;
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_244);
    b_00.first = pvVar4->first;
    b_00._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
    b_00.second = pvVar4->second;
    Interaction::Interaction((Interaction *)auStack_348,a_00,b_00,interaction_1._68_4_);
    i_01.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction_1._0_8_;
    i_01._0_8_ = auStack_348;
    i_01.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction_1.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_01.actionA.m_eproperty =
         (property_type *)
         interaction_1.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_01._32_8_ = interaction_1.actionA.m_eproperty;
    i_01.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction_1._32_8_
    ;
    i_01.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction_1.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_01.actionB.m_eproperty =
         (property_type *)
         interaction_1.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_01._64_8_ = interaction_1.actionB.m_eproperty;
    insertInteraction(this,i_01);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                       *)local_2d0);
  }
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        *)&actA);
  return;
}

Assistant:

Scenario::Scenario(const vector<std::vector<Edge> >& actions, 
									const vector<Graph>& graphs, 
									int numConflicts,
									int numSynergies) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numConflicts; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

	for (int i = 0; i < numSynergies; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, 0);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}
	
}